

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 34_findFirstAndLastPositionInSortedArray.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
searchRange(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
           vector<int,_std::allocator<int>_> *nums,int target)

{
  pointer piVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  initializer_list<int> __l;
  allocator_type local_19;
  int local_18;
  int local_14;
  int local_10 [2];
  
  piVar1 = (nums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar2 = (ulong)((long)(nums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  if (0 < (int)uVar2) {
    iVar8 = 0;
    uVar3 = uVar2 & 0xffffffff;
    do {
      uVar7 = (uint)(iVar8 + (int)uVar3) >> 1;
      uVar5 = (ulong)uVar7;
      if (piVar1[uVar5] < target) {
        iVar8 = uVar7 + 1;
        uVar5 = uVar3;
      }
      uVar3 = uVar5;
    } while (iVar8 < (int)uVar5);
    iVar4 = 0;
    if (0 < (int)uVar2) {
      do {
        uVar7 = (uint)(iVar4 + (int)uVar2) >> 1;
        uVar3 = (ulong)uVar7;
        if (piVar1[uVar3] <= target) {
          iVar4 = uVar7 + 1;
          uVar3 = uVar2;
        }
        uVar2 = uVar3;
      } while (iVar4 < (int)uVar3);
    }
    if (iVar8 != iVar4) {
      piVar6 = &local_18;
      local_14 = iVar4 + -1;
      local_18 = iVar8;
      goto LAB_00101297;
    }
  }
  piVar6 = local_10;
  local_10[0] = -1;
  local_10[1] = -1;
LAB_00101297:
  __l._M_len = 2;
  __l._M_array = piVar6;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l,&local_19);
  return __return_storage_ptr__;
}

Assistant:

vector<int> searchRange(vector<int>& nums, int target) {
    int start=0,end=nums.size(),mid,left,right;
    while (start<end)
    {
        mid=(start+end)/2;
        if (target<=nums[mid])
            end=mid;
        else
            start=mid+1;
    }
    left=start;
    start=0,end=nums.size();
    while (start<end)
    {
        mid=(start+end)/2;
        if (target<nums[mid])
            end=mid;
        else
            start=mid+1;
    }
    right=start;
    return left==right ? vector<int> {-1,-1} : vector<int>{left,right-1};
}